

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O0

int addk(FuncState *fs,TValue *key,TValue *v)

{
  lua_State *L_00;
  Proto *o;
  int iVar1;
  TValue *pTVar2;
  TValue *io2;
  TValue *io1;
  TValue *io;
  int oldsize;
  int k;
  TValue *idx;
  Proto *f;
  lua_State *L;
  TValue val;
  TValue *v_local;
  TValue *key_local;
  FuncState *fs_local;
  
  L_00 = fs->ls->L;
  o = fs->f;
  val._8_8_ = v;
  pTVar2 = luaH_get(fs->ls->h,key);
  if ((((pTVar2->tt_ != '\x03') ||
       (fs_local._4_4_ = (int)(pTVar2->value_).i, fs->nk <= fs_local._4_4_)) ||
      ((o->k[fs_local._4_4_].tt_ & 0x3f) != (*(byte *)(val._8_8_ + 8) & 0x3f))) ||
     (iVar1 = luaV_equalobj((lua_State *)0x0,o->k + fs_local._4_4_,(TValue *)val._8_8_), iVar1 == 0)
     ) {
    io._0_4_ = o->sizek;
    fs_local._4_4_ = fs->nk;
    L = (lua_State *)(long)fs_local._4_4_;
    val.value_.ub = '\x03';
    luaH_finishset(L_00,fs->ls->h,key,pTVar2,(TValue *)&L);
    pTVar2 = (TValue *)luaM_growaux_(L_00,o->k,fs_local._4_4_,&o->sizek,0x10,0x1ffffff,"constants");
    o->k = pTVar2;
    while ((int)io < o->sizek) {
      o->k[(int)io].tt_ = '\0';
      io._0_4_ = (int)io + 1;
    }
    pTVar2 = o->k;
    pTVar2[fs_local._4_4_].value_ = *(Value *)val._8_8_;
    pTVar2[fs_local._4_4_].tt_ = *(lu_byte *)(val._8_8_ + 8);
    fs->nk = fs->nk + 1;
    if ((((*(byte *)(val._8_8_ + 8) & 0x40) != 0) && ((o->marked & 0x20) != 0)) &&
       ((*(byte *)(*(long *)val._8_8_ + 9) & 0x18) != 0)) {
      luaC_barrier_(L_00,(GCObject *)o,*(GCObject **)val._8_8_);
    }
  }
  return fs_local._4_4_;
}

Assistant:

static int addk (FuncState *fs, TValue *key, TValue *v) {
  TValue val;
  lua_State *L = fs->ls->L;
  Proto *f = fs->f;
  const TValue *idx = luaH_get(fs->ls->h, key);  /* query scanner table */
  int k, oldsize;
  if (ttisinteger(idx)) {  /* is there an index there? */
    k = cast_int(ivalue(idx));
    /* correct value? (warning: must distinguish floats from integers!) */
    if (k < fs->nk && ttypetag(&f->k[k]) == ttypetag(v) &&
                      luaV_rawequalobj(&f->k[k], v))
      return k;  /* reuse index */
  }
  /* constant not found; create a new entry */
  oldsize = f->sizek;
  k = fs->nk;
  /* numerical value does not need GC barrier;
     table has no metatable, so it does not need to invalidate cache */
  setivalue(&val, k);
  luaH_finishset(L, fs->ls->h, key, idx, &val);
  luaM_growvector(L, f->k, k, f->sizek, TValue, MAXARG_Ax, "constants");
  while (oldsize < f->sizek) setnilvalue(&f->k[oldsize++]);
  setobj(L, &f->k[k], v);
  fs->nk++;
  luaC_barrier(L, f, v);
  return k;
}